

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Open(PersistentStorageJson *this)

{
  Status SVar1;
  
  if ((this->mFileName)._M_string_length == 0) {
    JsonDefault_abi_cxx11_((PersistentStorageJson *)&stack0xffffffffffffffe0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=(&this->mCache,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)&stack0xffffffffffffffe0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)&stack0xffffffffffffffe0);
  }
  CacheFromFile(this);
  SVar1 = CacheToFile(this);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Open()
{
    if (mFileName.empty())
    {
        // No persistence, use default contents
        mCache = JsonDefault();
    }
    CacheFromFile();
    return CacheToFile();
}